

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *headers,int parts)

{
  uint uVar1;
  __type _Var2;
  string *psVar3;
  uint v;
  ulong uVar4;
  bool bVar5;
  
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,0x1312f76);
  v = 0x1002;
  if (parts == 1) {
    psVar3 = Header::type_abi_cxx11_(headers);
    _Var2 = std::operator==(psVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)TILEDIMAGE_abi_cxx11_);
    v = (uint)_Var2 << 9 | 2;
  }
  uVar4 = 0;
  if (0 < parts) {
    uVar4 = (ulong)(uint)parts;
  }
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    bVar5 = usesLongNames(headers);
    uVar1 = v | 0x400;
    if (!bVar5) {
      uVar1 = v;
    }
    bVar5 = Header::hasType(headers);
    v = uVar1;
    if (bVar5) {
      psVar3 = Header::type_abi_cxx11_(headers);
      bVar5 = isImage(psVar3);
      if (!bVar5) {
        v = uVar1 | 0x800;
      }
    }
    headers = headers + 1;
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,v);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
                                                    const Header * headers,
                                                    int parts)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (parts == 1)
    {
        if (headers[0].type() == TILEDIMAGE)
            version |= TILED_FLAG;
    }
    else
    {
        version |= MULTI_PART_FILE_FLAG;
    }
    
    for (int i = 0; i < parts; i++)
    {
        if (usesLongNames (headers[i]))
            version |= LONG_NAMES_FLAG;

        if (headers[i].hasType() && isImage(headers[i].type()) == false)
            version |= NON_IMAGE_FLAG;
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}